

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# templated_column_writer.hpp
# Opt level: O0

void duckdb::TemplatedWritePlain<duckdb::float_na_equal,float,duckdb::FloatingPointOperator,false>
               (Vector *col,ColumnWriterStatistics *stats,idx_t chunk_start,idx_t chunk_end,
               ValidityMask *mask,WriteStream *ser)

{
  bool bVar1;
  data_ptr_t pdVar2;
  ulong in_RCX;
  long lVar3;
  ulong in_RDX;
  TemplatedValidityMask<unsigned_long> *in_R9;
  float fVar4;
  float target_value;
  idx_t r;
  idx_t local_write_count;
  float local_write [2048];
  float_na_equal *ptr;
  float in_stack_ffffffffffffdf9c;
  ColumnWriterStatistics *in_stack_ffffffffffffdfa0;
  TemplatedValidityMask<unsigned_long> *in_stack_ffffffffffffdfa8;
  ulong local_2048;
  long local_2040;
  float local_2038 [2048];
  float_na_equal *local_38;
  TemplatedValidityMask<unsigned_long> *local_30;
  ulong local_20;
  ulong local_18;
  
  local_30 = in_R9;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_38 = FlatVector::GetData<duckdb::float_na_equal>((Vector *)0x5a5a24);
  local_2040 = 0;
  for (local_2048 = local_18; local_2048 < local_20; local_2048 = local_2048 + 1) {
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (in_stack_ffffffffffffdfa8,(idx_t)in_stack_ffffffffffffdfa0);
    if (bVar1) {
      fVar4 = FloatingPointOperator::Operation<duckdb::float_na_equal,float>((float_na_equal)0x0);
      FloatingPointOperator::HandleStats<duckdb::float_na_equal,float>
                (in_stack_ffffffffffffdfa0,in_stack_ffffffffffffdf9c);
      lVar3 = local_2040 + 1;
      local_2038[local_2040] = fVar4;
      local_2040 = lVar3;
      if (lVar3 == 0x800) {
        in_stack_ffffffffffffdfa8 = local_30;
        pdVar2 = data_ptr_cast<float>(local_2038);
        (*(code *)**(undefined8 **)in_stack_ffffffffffffdfa8)
                  (in_stack_ffffffffffffdfa8,pdVar2,0x2000);
        local_2040 = 0;
      }
    }
  }
  pdVar2 = data_ptr_cast<float>(local_2038);
  (*(code *)**(undefined8 **)local_30)(local_30,pdVar2,local_2040 << 2);
  return;
}

Assistant:

static void TemplatedWritePlain(Vector &col, ColumnWriterStatistics *stats, const idx_t chunk_start,
                                const idx_t chunk_end, const ValidityMask &mask, WriteStream &ser) {
	static constexpr bool COPY_DIRECTLY_FROM_VECTOR =
	    ALL_VALID && std::is_same<SRC, TGT>::value && std::is_arithmetic<TGT>::value;

	const auto *const ptr = FlatVector::GetData<SRC>(col);

	TGT local_write[STANDARD_VECTOR_SIZE];
	idx_t local_write_count = 0;

	for (idx_t r = chunk_start; r < chunk_end; r++) {
		if (!ALL_VALID && !mask.RowIsValid(r)) {
			continue;
		}

		TGT target_value = OP::template Operation<SRC, TGT>(ptr[r]);
		OP::template HandleStats<SRC, TGT>(stats, target_value);

		if (COPY_DIRECTLY_FROM_VECTOR) {
			continue;
		}

		if (std::is_arithmetic<TGT>::value) {
			local_write[local_write_count++] = target_value;
			if (local_write_count == STANDARD_VECTOR_SIZE) {
				ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
				local_write_count = 0;
			}
		} else {
			OP::template WriteToStream<SRC, TGT>(target_value, ser);
		}
	}

	if (COPY_DIRECTLY_FROM_VECTOR) {
		ser.WriteData(const_data_ptr_cast(&ptr[chunk_start]), (chunk_end - chunk_start) * sizeof(TGT));
		return;
	}

	if (std::is_arithmetic<TGT>::value) {
		ser.WriteData(data_ptr_cast(local_write), local_write_count * sizeof(TGT));
	}
	// Else we already wrote to stream
}